

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceDirectly_Test::
~Units_flattenImportedUnitsWithNonStandardReferenceDirectly_Test
          (Units_flattenImportedUnitsWithNonStandardReferenceDirectly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceDirectly)
{
    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, "importer/units/base_model.cellml");

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr iu = libcellml::Units::create("per_fmol");
    iu->setImportSource(import);
    iu->setImportReference("per_fmol");

    model->addUnits(iu);

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(2), flatModel->unitsCount());
    EXPECT_EQ("per_fmol", flatModel->units(0)->name());
    EXPECT_EQ("fmol", flatModel->units(1)->name());
}